

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

char * xmlTextReaderBuildMessage(char *msg,__va_list_tag *ap)

{
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  char *pcVar5;
  undefined8 local_58;
  va_list aq;
  char *local_38;
  char *str;
  char *larger;
  int chars;
  int size;
  __va_list_tag *ap_local;
  char *msg_local;
  
  larger._4_4_ = 0;
  local_38 = (char *)0x0;
  pcVar5 = local_38;
  while( true ) {
    local_38 = pcVar5;
    local_58._0_4_ = ap->gp_offset;
    local_58._4_4_ = ap->fp_offset;
    aq[0]._0_8_ = ap->overflow_arg_area;
    aq[0].overflow_arg_area = ap->reg_save_area;
    iVar2 = vsnprintf(local_38,(long)larger._4_4_,msg,&local_58);
    if (iVar2 < 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"vsnprintf failed !\n");
      if (local_38 != (char *)0x0) {
        (*xmlFree)(local_38);
      }
      return (char *)0x0;
    }
    if ((iVar2 < larger._4_4_) || (larger._4_4_ == 64000)) break;
    if (iVar2 < 64000) {
      larger._4_4_ = iVar2 + 1;
    }
    else {
      larger._4_4_ = 64000;
    }
    pcVar5 = (char *)(*xmlRealloc)(local_38,(long)larger._4_4_);
    if (pcVar5 == (char *)0x0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar4,"xmlRealloc failed !\n");
      if (local_38 != (char *)0x0) {
        (*xmlFree)(local_38);
      }
      return (char *)0x0;
    }
  }
  return local_38;
}

Assistant:

static char *
xmlTextReaderBuildMessage(const char *msg, va_list ap) {
    int size = 0;
    int chars;
    char *larger;
    char *str = NULL;
    va_list aq;

    while (1) {
        VA_COPY(aq, ap);
        chars = vsnprintf(str, size, msg, aq);
        va_end(aq);
        if (chars < 0) {
	    xmlGenericError(xmlGenericErrorContext, "vsnprintf failed !\n");
	    if (str)
		xmlFree(str);
	    return NULL;
	}
	if ((chars < size) || (size == MAX_ERR_MSG_SIZE))
            break;
        if (chars < MAX_ERR_MSG_SIZE)
	size = chars + 1;
	else
		size = MAX_ERR_MSG_SIZE;
        if ((larger = (char *) xmlRealloc(str, size)) == NULL) {
	    xmlGenericError(xmlGenericErrorContext, "xmlRealloc failed !\n");
	    if (str)
                xmlFree(str);
            return NULL;
        }
        str = larger;
    }

    return str;
}